

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O2

int deflate(z_streamp_conflict strm,int flush)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  deflate_state *s;
  Bytef *pBVar4;
  Bytef *pBVar5;
  Posf *__s;
  bool bVar6;
  long lVar7;
  Bytef BVar8;
  uInt uVar9;
  uint uVar10;
  block_state bVar11;
  uLong uVar12;
  gz_headerp pgVar13;
  ulong uVar14;
  ulong uVar15;
  uInt uVar16;
  Bytef *pBVar17;
  long lVar18;
  long lVar19;
  byte bVar20;
  int iVar21;
  uint uVar22;
  long lVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  int local_48;
  
  if (strm == (z_streamp_conflict)0x0) {
    return -2;
  }
  s = (deflate_state *)strm->state;
  if (5 < (uint)flush || s == (deflate_state *)0x0) {
    return -2;
  }
  if ((strm->next_out == (Bytef *)0x0) ||
     (((strm->next_in == (Bytef *)0x0 && (strm->avail_in != 0)) ||
      (iVar21 = s->status, flush != 4 && iVar21 == 0x29a)))) {
    strm->msg = "stream error";
    return -2;
  }
  if (strm->avail_out == 0) goto LAB_003ab9bd;
  s->strm = strm;
  iVar1 = s->last_flush;
  s->last_flush = flush;
  if (iVar21 == 0x2a) {
    if (s->wrap != 2) {
      uVar22 = s->w_bits * 0x1000 - 0x7800;
      uVar10 = 0;
      if ((s->strategy < 2) && (uVar3 = s->level, uVar10 = 0, 1 < (int)uVar3)) {
        if (uVar3 < 6) {
          uVar10 = 0x40;
        }
        else {
          uVar10 = (uVar3 != 6 | 2) << 6;
        }
      }
      uVar3 = uVar10 + 0x20 + uVar22;
      if (s->strstart == 0) {
        uVar3 = uVar10 | uVar22;
      }
      s->status = 0x71;
      putShortMSB(s,(uVar3 | uVar3 % 0x1f) ^ 0x1f);
      if (s->strstart != 0) {
        putShortMSB(s,*(uInt *)((long)&strm->adler + 2));
        putShortMSB(s,(uint)(ushort)strm->adler);
      }
      uVar12 = adler32(0,(Bytef *)0x0,0);
      strm->adler = uVar12;
      iVar21 = s->status;
      goto LAB_003ab6c3;
    }
    uVar12 = crc32(0,(uchar *)0x0,0);
    strm->adler = uVar12;
    uVar10 = s->pending;
    s->pending = uVar10 + 1;
    s->pending_buf[uVar10] = '\x1f';
    uVar10 = s->pending;
    s->pending = uVar10 + 1;
    s->pending_buf[uVar10] = 0x8b;
    uVar10 = s->pending;
    s->pending = uVar10 + 1;
    s->pending_buf[uVar10] = '\b';
    pgVar13 = s->gzhead;
    if (pgVar13 != (gz_headerp)0x0) {
      iVar21 = pgVar13->text;
      iVar2 = pgVar13->hcrc;
      pBVar17 = pgVar13->extra;
      pBVar4 = pgVar13->name;
      pBVar5 = pgVar13->comment;
      uVar10 = s->pending;
      s->pending = uVar10 + 1;
      s->pending_buf[uVar10] =
           (pBVar5 != (Bytef *)0x0) << 4 |
           (pBVar4 != (Bytef *)0x0) << 3 |
           (pBVar17 != (Bytef *)0x0) << 2 | (iVar2 != 0) * '\x02' | iVar21 != 0;
      uVar12 = s->gzhead->time;
      uVar10 = s->pending;
      s->pending = uVar10 + 1;
      s->pending_buf[uVar10] = (Bytef)uVar12;
      BVar8 = *(Bytef *)((long)&s->gzhead->time + 1);
      uVar10 = s->pending;
      s->pending = uVar10 + 1;
      s->pending_buf[uVar10] = BVar8;
      BVar8 = *(Bytef *)((long)&s->gzhead->time + 2);
      uVar10 = s->pending;
      s->pending = uVar10 + 1;
      s->pending_buf[uVar10] = BVar8;
      BVar8 = *(Bytef *)((long)&s->gzhead->time + 3);
      uVar10 = s->pending;
      s->pending = uVar10 + 1;
      s->pending_buf[uVar10] = BVar8;
      BVar8 = '\x02';
      if (s->level != 9) {
        BVar8 = (s->level < 2 || 1 < s->strategy) << 2;
      }
      uVar10 = s->pending;
      s->pending = uVar10 + 1;
      s->pending_buf[uVar10] = BVar8;
      iVar21 = s->gzhead->os;
      uVar10 = s->pending;
      s->pending = uVar10 + 1;
      s->pending_buf[uVar10] = (Bytef)iVar21;
      pgVar13 = s->gzhead;
      if (pgVar13->extra != (Bytef *)0x0) {
        uVar9 = pgVar13->extra_len;
        uVar10 = s->pending;
        s->pending = uVar10 + 1;
        s->pending_buf[uVar10] = (Bytef)uVar9;
        BVar8 = *(Bytef *)((long)&s->gzhead->extra_len + 1);
        uVar10 = s->pending;
        s->pending = uVar10 + 1;
        s->pending_buf[uVar10] = BVar8;
        pgVar13 = s->gzhead;
      }
      if (pgVar13->hcrc != 0) {
        uVar12 = crc32(strm->adler,s->pending_buf,s->pending);
        strm->adler = uVar12;
      }
      s->gzindex = 0;
      s->status = 0x45;
      goto LAB_003ab6cc;
    }
    uVar10 = s->pending;
    s->pending = uVar10 + 1;
    s->pending_buf[uVar10] = '\0';
    uVar10 = s->pending;
    s->pending = uVar10 + 1;
    s->pending_buf[uVar10] = '\0';
    uVar10 = s->pending;
    s->pending = uVar10 + 1;
    s->pending_buf[uVar10] = '\0';
    uVar10 = s->pending;
    s->pending = uVar10 + 1;
    s->pending_buf[uVar10] = '\0';
    uVar10 = s->pending;
    s->pending = uVar10 + 1;
    s->pending_buf[uVar10] = '\0';
    BVar8 = '\x02';
    if (s->level != 9) {
      BVar8 = (s->level < 2 || 1 < s->strategy) << 2;
    }
    uVar10 = s->pending;
    s->pending = uVar10 + 1;
    s->pending_buf[uVar10] = BVar8;
    uVar10 = s->pending;
    s->pending = uVar10 + 1;
    s->pending_buf[uVar10] = '\x03';
LAB_003ab977:
    s->status = 0x71;
  }
  else {
LAB_003ab6c3:
    if (iVar21 == 0x45) {
LAB_003ab6cc:
      pgVar13 = s->gzhead;
      if (pgVar13->extra != (Bytef *)0x0) {
        uVar9 = s->pending;
        uVar16 = s->gzindex;
        while (uVar16 < (ushort)pgVar13->extra_len) {
          uVar10 = s->pending;
          uVar14 = (ulong)uVar10;
          if (s->pending_buf_size == uVar14) {
            if ((pgVar13->hcrc != 0) && (uVar9 <= uVar10 && uVar10 - uVar9 != 0)) {
              uVar12 = crc32(strm->adler,s->pending_buf + uVar9,uVar10 - uVar9);
              strm->adler = uVar12;
            }
            flush_pending(strm);
            uVar9 = s->pending;
            uVar14 = (ulong)uVar9;
            pgVar13 = s->gzhead;
            if (s->pending_buf_size == uVar14) break;
            uVar16 = s->gzindex;
          }
          BVar8 = pgVar13->extra[uVar16];
          s->pending = (int)uVar14 + 1;
          s->pending_buf[uVar14] = BVar8;
          uVar16 = s->gzindex + 1;
          s->gzindex = uVar16;
          pgVar13 = s->gzhead;
        }
        if ((pgVar13->hcrc != 0) &&
           (uVar16 = s->pending - uVar9, uVar9 <= s->pending && uVar16 != 0)) {
          uVar12 = crc32(strm->adler,s->pending_buf + uVar9,uVar16);
          strm->adler = uVar12;
          pgVar13 = s->gzhead;
        }
        if (s->gzindex != pgVar13->extra_len) {
          iVar21 = s->status;
          goto LAB_003ab78c;
        }
        s->gzindex = 0;
      }
      s->status = 0x49;
LAB_003ab799:
      if (pgVar13->name != (Bytef *)0x0) {
        uVar9 = s->pending;
        do {
          uVar10 = s->pending;
          uVar14 = (ulong)uVar10;
          pgVar13 = s->gzhead;
          if (s->pending_buf_size == uVar14) {
            if ((pgVar13->hcrc != 0) && (uVar9 <= uVar10 && uVar10 - uVar9 != 0)) {
              uVar12 = crc32(strm->adler,s->pending_buf + uVar9,uVar10 - uVar9);
              strm->adler = uVar12;
            }
            flush_pending(strm);
            uVar9 = s->pending;
            uVar14 = (ulong)uVar9;
            if (s->pending_buf_size == uVar14) {
              bVar6 = false;
              goto LAB_003ab813;
            }
            pgVar13 = s->gzhead;
          }
          pBVar17 = pgVar13->name;
          uVar10 = s->gzindex;
          s->gzindex = uVar10 + 1;
          BVar8 = pBVar17[uVar10];
          s->pending = (int)uVar14 + 1;
          s->pending_buf[uVar14] = BVar8;
        } while (BVar8 != '\0');
        bVar6 = true;
        uVar14 = (ulong)uVar9;
LAB_003ab813:
        if ((s->gzhead->hcrc != 0) &&
           (uVar9 = s->pending - (uint)uVar14, (uint)uVar14 <= s->pending && uVar9 != 0)) {
          uVar12 = crc32(strm->adler,s->pending_buf + uVar14,uVar9);
          strm->adler = uVar12;
        }
        if (!bVar6) {
          iVar21 = s->status;
          goto LAB_003ab84e;
        }
        s->gzindex = 0;
      }
      s->status = 0x5b;
LAB_003ab857:
      if (s->gzhead->comment != (Bytef *)0x0) {
        uVar9 = s->pending;
        do {
          uVar10 = s->pending;
          uVar14 = (ulong)uVar10;
          pgVar13 = s->gzhead;
          if (s->pending_buf_size == uVar14) {
            if ((pgVar13->hcrc != 0) && (uVar9 <= uVar10 && uVar10 - uVar9 != 0)) {
              uVar12 = crc32(strm->adler,s->pending_buf + uVar9,uVar10 - uVar9);
              strm->adler = uVar12;
            }
            flush_pending(strm);
            uVar9 = s->pending;
            uVar14 = (ulong)uVar9;
            if (s->pending_buf_size == uVar14) {
              bVar6 = false;
              goto LAB_003ab8d5;
            }
            pgVar13 = s->gzhead;
          }
          pBVar17 = pgVar13->comment;
          uVar10 = s->gzindex;
          s->gzindex = uVar10 + 1;
          BVar8 = pBVar17[uVar10];
          s->pending = (int)uVar14 + 1;
          s->pending_buf[uVar14] = BVar8;
        } while (BVar8 != '\0');
        bVar6 = true;
        uVar14 = (ulong)uVar9;
LAB_003ab8d5:
        if ((s->gzhead->hcrc != 0) &&
           (uVar9 = s->pending - (uint)uVar14, (uint)uVar14 <= s->pending && uVar9 != 0)) {
          uVar12 = crc32(strm->adler,s->pending_buf + uVar14,uVar9);
          strm->adler = uVar12;
        }
        if (!bVar6) {
          iVar21 = s->status;
          goto LAB_003ab90c;
        }
      }
      s->status = 0x67;
LAB_003ab911:
      if (s->gzhead->hcrc != 0) {
        uVar9 = s->pending;
        uVar15 = (ulong)(uVar9 + 2);
        uVar14 = s->pending_buf_size;
        if (uVar14 < uVar15) {
          flush_pending(strm);
          uVar9 = s->pending;
          uVar14 = s->pending_buf_size;
          uVar15 = (ulong)(uVar9 + 2);
        }
        if (uVar14 < uVar15) goto LAB_003ab97e;
        uVar12 = strm->adler;
        s->pending = uVar9 + 1;
        s->pending_buf[uVar9] = (Bytef)uVar12;
        BVar8 = *(Bytef *)((long)&strm->adler + 1);
        uVar10 = s->pending;
        s->pending = uVar10 + 1;
        s->pending_buf[uVar10] = BVar8;
        uVar12 = crc32(0,(uchar *)0x0,0);
        strm->adler = uVar12;
      }
      goto LAB_003ab977;
    }
LAB_003ab78c:
    if (iVar21 == 0x49) {
      pgVar13 = s->gzhead;
      goto LAB_003ab799;
    }
LAB_003ab84e:
    if (iVar21 == 0x5b) goto LAB_003ab857;
LAB_003ab90c:
    if (iVar21 == 0x67) goto LAB_003ab911;
  }
LAB_003ab97e:
  if (s->pending == 0) {
    if (((strm->avail_in == 0) && (flush != 4)) && (flush <= iVar1)) goto LAB_003ab9bd;
  }
  else {
    flush_pending(strm);
    if (strm->avail_out == 0) goto LAB_003abffe;
  }
  if (s->status == 0x29a) {
    if (strm->avail_in != 0) {
LAB_003ab9bd:
      strm->msg = "buffer error";
      return -5;
    }
LAB_003ab9d8:
    if (s->lookahead == 0) {
      if (flush == 0) {
        return 0;
      }
      if (s->status == 0x29a) goto LAB_003abf3d;
    }
  }
  else if (strm->avail_in == 0) goto LAB_003ab9d8;
  if (s->strategy == 3) {
    do {
      do {
        uVar10 = s->lookahead;
        if (uVar10 < 0x102) {
          fill_window(s);
          uVar10 = s->lookahead;
          if (flush == 0 && uVar10 < 0x102) goto LAB_003abed3;
          if (uVar10 == 0) goto LAB_003abe31;
          s->match_length = 0;
          uVar9 = s->strstart;
          if (2 < uVar10) goto LAB_003abb3d;
          pBVar17 = s->window;
LAB_003abc67:
          uVar16 = s->last_lit;
          uVar14 = (ulong)uVar9;
LAB_003abc6f:
          bVar20 = pBVar17[uVar14];
          s->d_buf[uVar16] = 0;
          s->last_lit = uVar16 + 1;
          s->l_buf[uVar16] = bVar20;
          s->dyn_ltree[bVar20].fc.freq = s->dyn_ltree[bVar20].fc.freq + 1;
          uVar9 = s->last_lit;
          uVar16 = s->lit_bufsize;
          s->lookahead = s->lookahead - 1;
          uVar10 = s->strstart + 1;
        }
        else {
          s->match_length = 0;
          uVar9 = s->strstart;
LAB_003abb3d:
          pBVar17 = s->window;
          if (uVar9 == 0) {
            uVar9 = 0;
            goto LAB_003abc67;
          }
          uVar14 = (ulong)uVar9;
          BVar8 = pBVar17[uVar14 - 1];
          if (((BVar8 != pBVar17[uVar14]) || (pBVar4 = pBVar17 + uVar14, BVar8 != pBVar4[1])) ||
             (BVar8 != pBVar4[2])) goto LAB_003abc67;
          local_48 = (int)pBVar4 + 0x102;
          lVar23 = uVar14 + 2;
          lVar18 = uVar14 + 4;
          lVar24 = uVar14 + 5;
          lVar25 = uVar14 + 6;
          lVar27 = uVar14 + 7;
          lVar28 = uVar14 + 9;
          uVar15 = 2;
          lVar19 = uVar14 + 3;
          uVar26 = uVar14;
          do {
            uVar26 = uVar26 + 8;
            iVar21 = (int)pBVar17;
            if (BVar8 != pBVar17[lVar19]) {
              iVar21 = (int)lVar19 + iVar21;
              goto LAB_003abd47;
            }
            if (BVar8 != pBVar17[lVar19 + 1]) {
              iVar21 = (int)lVar18 + iVar21;
              goto LAB_003abd47;
            }
            if (BVar8 != pBVar17[lVar19 + 2]) {
              iVar21 = (int)lVar24 + iVar21;
              goto LAB_003abd47;
            }
            if (BVar8 != pBVar17[lVar19 + 3]) {
              iVar21 = (int)lVar25 + iVar21;
              goto LAB_003abd47;
            }
            if (BVar8 != pBVar17[lVar19 + 4]) {
              iVar21 = (int)lVar27 + iVar21;
              goto LAB_003abd47;
            }
            if (BVar8 != pBVar17[lVar19 + 5]) {
              iVar21 = (int)uVar26 + iVar21;
              goto LAB_003abd47;
            }
            if (BVar8 != pBVar17[lVar19 + 6]) {
              iVar21 = (int)lVar28 + iVar21;
              goto LAB_003abd47;
            }
            lVar23 = lVar23 + 8;
            if (0xf9 < uVar15) break;
            uVar15 = uVar15 + 8;
            lVar18 = lVar18 + 8;
            lVar24 = lVar24 + 8;
            lVar25 = lVar25 + 8;
            lVar27 = lVar27 + 8;
            lVar28 = lVar28 + 8;
            lVar7 = lVar19 + 7;
            lVar19 = lVar19 + 8;
          } while (BVar8 == pBVar17[lVar7]);
          iVar21 = (int)lVar23 + iVar21;
LAB_003abd47:
          uVar22 = (iVar21 - local_48) + 0x102;
          if (uVar10 <= uVar22) {
            uVar22 = uVar10;
          }
          s->match_length = uVar22;
          uVar16 = s->last_lit;
          if (uVar22 < 3) goto LAB_003abc6f;
          bVar20 = (char)uVar22 - 3;
          s->d_buf[uVar16] = 1;
          s->last_lit = uVar16 + 1;
          s->l_buf[uVar16] = bVar20;
          s->dyn_ltree[(ulong)""[bVar20] + 0x101].fc.freq =
               s->dyn_ltree[(ulong)""[bVar20] + 0x101].fc.freq + 1;
          s->dyn_dtree[0].fc.freq = s->dyn_dtree[0].fc.freq + 1;
          uVar9 = s->last_lit;
          uVar16 = s->lit_bufsize;
          s->lookahead = s->lookahead - s->match_length;
          uVar10 = s->match_length + s->strstart;
          s->match_length = 0;
        }
        s->strstart = uVar10;
      } while (uVar9 != uVar16 - 1);
      uVar14 = s->block_start;
      if ((long)uVar14 < 0) {
        pBVar17 = (Bytef *)0x0;
      }
      else {
        pBVar17 = s->window + (uVar14 & 0xffffffff);
      }
      _tr_flush_block(s,(charf *)pBVar17,uVar10 - uVar14,0);
      s->block_start = (ulong)s->strstart;
      flush_pending(s->strm);
    } while (s->strm->avail_out != 0);
    goto LAB_003abed3;
  }
  if (s->strategy == 2) {
    do {
      do {
        if ((s->lookahead == 0) && (fill_window(s), s->lookahead == 0)) {
          if (flush != 0) goto LAB_003abe31;
          goto LAB_003abed3;
        }
        s->match_length = 0;
        bVar20 = s->window[s->strstart];
        uVar10 = s->last_lit;
        s->d_buf[uVar10] = 0;
        s->last_lit = uVar10 + 1;
        s->l_buf[uVar10] = bVar20;
        s->dyn_ltree[bVar20].fc.freq = s->dyn_ltree[bVar20].fc.freq + 1;
        s->lookahead = s->lookahead - 1;
        uVar10 = s->strstart + 1;
        s->strstart = uVar10;
      } while (s->last_lit != s->lit_bufsize - 1);
      uVar14 = s->block_start;
      if ((long)uVar14 < 0) {
        pBVar17 = (Bytef *)0x0;
      }
      else {
        pBVar17 = s->window + (uVar14 & 0xffffffff);
      }
      _tr_flush_block(s,(charf *)pBVar17,uVar10 - uVar14,0);
      s->block_start = (ulong)s->strstart;
      flush_pending(s->strm);
    } while (s->strm->avail_out != 0);
    goto LAB_003abed3;
  }
  bVar11 = (*configuration_table[s->level].func)(s,flush);
LAB_003abe9c:
  if ((bVar11 & ~block_done) == finish_started) {
    s->status = 0x29a;
  }
  if ((bVar11 & ~finish_started) != need_more) {
    if (bVar11 == block_done) {
      if (flush != 5) {
        if (flush == 1) {
          _tr_align(s);
        }
        else {
          _tr_stored_block(s,(charf *)0x0,0,0);
          if (flush == 3) {
            __s = s->head;
            uVar14 = (ulong)(s->hash_size - 1);
            __s[uVar14] = 0;
            memset(__s,0,uVar14 * 2);
            if (s->lookahead == 0) {
              s->strstart = 0;
              s->block_start = 0;
            }
          }
        }
      }
      flush_pending(strm);
      if (strm->avail_out == 0) {
LAB_003abffe:
        s->last_flush = -1;
        return 0;
      }
    }
LAB_003abf3d:
    if (flush != 4) {
      return 0;
    }
    if (s->wrap < 1) {
      return 1;
    }
    uVar12 = strm->adler;
    if (s->wrap == 2) {
      uVar10 = s->pending;
      s->pending = uVar10 + 1;
      s->pending_buf[uVar10] = (Bytef)uVar12;
      BVar8 = *(Bytef *)((long)&strm->adler + 1);
      uVar10 = s->pending;
      s->pending = uVar10 + 1;
      s->pending_buf[uVar10] = BVar8;
      BVar8 = *(Bytef *)((long)&strm->adler + 2);
      uVar10 = s->pending;
      s->pending = uVar10 + 1;
      s->pending_buf[uVar10] = BVar8;
      BVar8 = *(Bytef *)((long)&strm->adler + 3);
      uVar10 = s->pending;
      s->pending = uVar10 + 1;
      s->pending_buf[uVar10] = BVar8;
      uVar12 = strm->total_in;
      uVar10 = s->pending;
      s->pending = uVar10 + 1;
      s->pending_buf[uVar10] = (Bytef)uVar12;
      BVar8 = *(Bytef *)((long)&strm->total_in + 1);
      uVar10 = s->pending;
      s->pending = uVar10 + 1;
      s->pending_buf[uVar10] = BVar8;
      BVar8 = *(Bytef *)((long)&strm->total_in + 2);
      uVar10 = s->pending;
      s->pending = uVar10 + 1;
      s->pending_buf[uVar10] = BVar8;
      BVar8 = *(Bytef *)((long)&strm->total_in + 3);
      uVar10 = s->pending;
      s->pending = uVar10 + 1;
      s->pending_buf[uVar10] = BVar8;
    }
    else {
      putShortMSB(s,(uInt)(uVar12 >> 0x10));
      putShortMSB(s,(uint)(ushort)strm->adler);
    }
    flush_pending(strm);
    if (0 < s->wrap) {
      s->wrap = -s->wrap;
    }
    return (uint)(s->pending == 0);
  }
LAB_003abed3:
  if (strm->avail_out == 0) {
    s->last_flush = -1;
    return 0;
  }
  return 0;
LAB_003abe31:
  uVar14 = s->block_start;
  if ((long)uVar14 < 0) {
    pBVar17 = (Bytef *)0x0;
  }
  else {
    pBVar17 = s->window + (uVar14 & 0xffffffff);
  }
  _tr_flush_block(s,(charf *)pBVar17,s->strstart - uVar14,(uint)(flush == 4));
  s->block_start = (ulong)s->strstart;
  flush_pending(s->strm);
  if (s->strm->avail_out == 0) {
    bVar11 = (uint)(flush == 4) * 2;
  }
  else {
    bVar11 = (uint)(flush == 4) * 2 + block_done;
  }
  goto LAB_003abe9c;
}

Assistant:

int ZEXPORT deflate (z_streamp strm, int flush)
{
    int old_flush; /* value of flush param for previous deflate call */
    deflate_state *s;

    if (strm == Z_NULL || strm->state == Z_NULL ||
        flush > Z_BLOCK || flush < 0) {
        return Z_STREAM_ERROR;
    }
    s = strm->state;

    if (strm->next_out == Z_NULL ||
        (strm->next_in == Z_NULL && strm->avail_in != 0) ||
        (s->status == FINISH_STATE && flush != Z_FINISH)) {
        ERR_RETURN(strm, Z_STREAM_ERROR);
    }
    if (strm->avail_out == 0) ERR_RETURN(strm, Z_BUF_ERROR);

    s->strm = strm; /* just in case */
    old_flush = s->last_flush;
    s->last_flush = flush;

    /* Write the header */
    if (s->status == INIT_STATE) {
#ifdef GZIP
        if (s->wrap == 2) {
            strm->adler = crc32(0L, Z_NULL, 0);
            put_byte(s, 31);
            put_byte(s, 139);
            put_byte(s, 8);
            if (s->gzhead == Z_NULL) {
                put_byte(s, 0);
                put_byte(s, 0);
                put_byte(s, 0);
                put_byte(s, 0);
                put_byte(s, 0);
                put_byte(s, s->level == 9 ? 2 :
                            (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2 ?
                             4 : 0));
                put_byte(s, OS_CODE);
                s->status = BUSY_STATE;
            }
            else {
                put_byte(s, (s->gzhead->text ? 1 : 0) +
                            (s->gzhead->hcrc ? 2 : 0) +
                            (s->gzhead->extra == Z_NULL ? 0 : 4) +
                            (s->gzhead->name == Z_NULL ? 0 : 8) +
                            (s->gzhead->comment == Z_NULL ? 0 : 16)
                        );
                put_byte(s, (Byte)(s->gzhead->time & 0xff));
                put_byte(s, (Byte)((s->gzhead->time >> 8) & 0xff));
                put_byte(s, (Byte)((s->gzhead->time >> 16) & 0xff));
                put_byte(s, (Byte)((s->gzhead->time >> 24) & 0xff));
                put_byte(s, s->level == 9 ? 2 :
                            (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2 ?
                             4 : 0));
                put_byte(s, s->gzhead->os & 0xff);
                if (s->gzhead->extra != Z_NULL) {
                    put_byte(s, s->gzhead->extra_len & 0xff);
                    put_byte(s, (s->gzhead->extra_len >> 8) & 0xff);
                }
                if (s->gzhead->hcrc)
                    strm->adler = crc32(strm->adler, s->pending_buf,
                                        s->pending);
                s->gzindex = 0;
                s->status = EXTRA_STATE;
            }
        }
        else
#endif
        {
            uInt header = (Z_DEFLATED + ((s->w_bits-8)<<4)) << 8;
            uInt level_flags;

            if (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2)
                level_flags = 0;
            else if (s->level < 6)
                level_flags = 1;
            else if (s->level == 6)
                level_flags = 2;
            else
                level_flags = 3;
            header |= (level_flags << 6);
            if (s->strstart != 0) header |= PRESET_DICT;
            header += 31 - (header % 31);

            s->status = BUSY_STATE;
            putShortMSB(s, header);

            /* Save the adler32 of the preset dictionary: */
            if (s->strstart != 0) {
                putShortMSB(s, (uInt)(strm->adler >> 16));
                putShortMSB(s, (uInt)(strm->adler & 0xffff));
            }
            strm->adler = adler32(0L, Z_NULL, 0);
        }
    }
#ifdef GZIP
    if (s->status == EXTRA_STATE) {
        if (s->gzhead->extra != Z_NULL) {
            uInt beg = s->pending;  /* start of bytes to update crc */

            while (s->gzindex < (s->gzhead->extra_len & 0xffff)) {
                if (s->pending == s->pending_buf_size) {
                    if (s->gzhead->hcrc && s->pending > beg)
                        strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                            s->pending - beg);
                    flush_pending(strm);
                    beg = s->pending;
                    if (s->pending == s->pending_buf_size)
                        break;
                }
                put_byte(s, s->gzhead->extra[s->gzindex]);
                s->gzindex++;
            }
            if (s->gzhead->hcrc && s->pending > beg)
                strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                    s->pending - beg);
            if (s->gzindex == s->gzhead->extra_len) {
                s->gzindex = 0;
                s->status = NAME_STATE;
            }
        }
        else
            s->status = NAME_STATE;
    }
    if (s->status == NAME_STATE) {
        if (s->gzhead->name != Z_NULL) {
            uInt beg = s->pending;  /* start of bytes to update crc */
            int val;

            do {
                if (s->pending == s->pending_buf_size) {
                    if (s->gzhead->hcrc && s->pending > beg)
                        strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                            s->pending - beg);
                    flush_pending(strm);
                    beg = s->pending;
                    if (s->pending == s->pending_buf_size) {
                        val = 1;
                        break;
                    }
                }
                val = s->gzhead->name[s->gzindex++];
                put_byte(s, val);
            } while (val != 0);
            if (s->gzhead->hcrc && s->pending > beg)
                strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                    s->pending - beg);
            if (val == 0) {
                s->gzindex = 0;
                s->status = COMMENT_STATE;
            }
        }
        else
            s->status = COMMENT_STATE;
    }
    if (s->status == COMMENT_STATE) {
        if (s->gzhead->comment != Z_NULL) {
            uInt beg = s->pending;  /* start of bytes to update crc */
            int val;

            do {
                if (s->pending == s->pending_buf_size) {
                    if (s->gzhead->hcrc && s->pending > beg)
                        strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                            s->pending - beg);
                    flush_pending(strm);
                    beg = s->pending;
                    if (s->pending == s->pending_buf_size) {
                        val = 1;
                        break;
                    }
                }
                val = s->gzhead->comment[s->gzindex++];
                put_byte(s, val);
            } while (val != 0);
            if (s->gzhead->hcrc && s->pending > beg)
                strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                    s->pending - beg);
            if (val == 0)
                s->status = HCRC_STATE;
        }
        else
            s->status = HCRC_STATE;
    }
    if (s->status == HCRC_STATE) {
        if (s->gzhead->hcrc) {
            if (s->pending + 2 > s->pending_buf_size)
                flush_pending(strm);
            if (s->pending + 2 <= s->pending_buf_size) {
                put_byte(s, (Byte)(strm->adler & 0xff));
                put_byte(s, (Byte)((strm->adler >> 8) & 0xff));
                strm->adler = crc32(0L, Z_NULL, 0);
                s->status = BUSY_STATE;
            }
        }
        else
            s->status = BUSY_STATE;
    }
#endif

    /* Flush as much pending output as possible */
    if (s->pending != 0) {
        flush_pending(strm);
        if (strm->avail_out == 0) {
            /* Since avail_out is 0, deflate will be called again with
             * more output space, but possibly with both pending and
             * avail_in equal to zero. There won't be anything to do,
             * but this is not an error situation so make sure we
             * return OK instead of BUF_ERROR at next call of deflate:
             */
            s->last_flush = -1;
            return Z_OK;
        }

    /* Make sure there is something to do and avoid duplicate consecutive
     * flushes. For repeated and useless calls with Z_FINISH, we keep
     * returning Z_STREAM_END instead of Z_BUF_ERROR.
     */
    } else if (strm->avail_in == 0 && flush <= old_flush &&
               flush != Z_FINISH) {
        ERR_RETURN(strm, Z_BUF_ERROR);
    }

    /* User must not provide more input after the first FINISH: */
    if (s->status == FINISH_STATE && strm->avail_in != 0) {
        ERR_RETURN(strm, Z_BUF_ERROR);
    }

    /* Start a new block or continue the current one.
     */
    if (strm->avail_in != 0 || s->lookahead != 0 ||
        (flush != Z_NO_FLUSH && s->status != FINISH_STATE)) {
        block_state bstate;

        bstate = s->strategy == Z_HUFFMAN_ONLY ? deflate_huff(s, flush) :
                    (s->strategy == Z_RLE ? deflate_rle(s, flush) :
                        (*(configuration_table[s->level].func))(s, flush));

        if (bstate == finish_started || bstate == finish_done) {
            s->status = FINISH_STATE;
        }
        if (bstate == need_more || bstate == finish_started) {
            if (strm->avail_out == 0) {
                s->last_flush = -1; /* avoid BUF_ERROR next call, see above */
            }
            return Z_OK;
            /* If flush != Z_NO_FLUSH && avail_out == 0, the next call
             * of deflate should use the same flush parameter to make sure
             * that the flush is complete. So we don't have to output an
             * empty block here, this will be done at next call. This also
             * ensures that for a very small output buffer, we emit at most
             * one empty block.
             */
        }
        if (bstate == block_done) {
            if (flush == Z_PARTIAL_FLUSH) {
                _tr_align(s);
            } else if (flush != Z_BLOCK) { /* FULL_FLUSH or SYNC_FLUSH */
                _tr_stored_block(s, (char*)0, 0L, 0);
                /* For a full flush, this empty block will be recognized
                 * as a special marker by inflate_sync().
                 */
                if (flush == Z_FULL_FLUSH) {
                    CLEAR_HASH(s);             /* forget history */
                    if (s->lookahead == 0) {
                        s->strstart = 0;
                        s->block_start = 0L;
                    }
                }
            }
            flush_pending(strm);
            if (strm->avail_out == 0) {
              s->last_flush = -1; /* avoid BUF_ERROR at next call, see above */
              return Z_OK;
            }
        }
    }
    Assert(strm->avail_out > 0, "bug2");

    if (flush != Z_FINISH) return Z_OK;
    if (s->wrap <= 0) return Z_STREAM_END;

    /* Write the trailer */
#ifdef GZIP
    if (s->wrap == 2) {
        put_byte(s, (Byte)(strm->adler & 0xff));
        put_byte(s, (Byte)((strm->adler >> 8) & 0xff));
        put_byte(s, (Byte)((strm->adler >> 16) & 0xff));
        put_byte(s, (Byte)((strm->adler >> 24) & 0xff));
        put_byte(s, (Byte)(strm->total_in & 0xff));
        put_byte(s, (Byte)((strm->total_in >> 8) & 0xff));
        put_byte(s, (Byte)((strm->total_in >> 16) & 0xff));
        put_byte(s, (Byte)((strm->total_in >> 24) & 0xff));
    }
    else
#endif
    {
        putShortMSB(s, (uInt)(strm->adler >> 16));
        putShortMSB(s, (uInt)(strm->adler & 0xffff));
    }
    flush_pending(strm);
    /* If avail_out is zero, the application will call deflate again
     * to flush the rest.
     */
    if (s->wrap > 0) s->wrap = -s->wrap; /* write the trailer only once! */
    return s->pending != 0 ? Z_OK : Z_STREAM_END;
}